

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

char * ucnv_io_getConverterName_63(char *alias,UBool *containsOption,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    if (iVar3 == 1) {
      if (*alias != 'x') {
        return (char *)0x0;
      }
      if (alias[1] != '-') {
        return (char *)0x0;
      }
      alias = alias + 2;
    }
    else if (iVar3 == 2) {
      return (char *)0x0;
    }
    UVar1 = haveAliasData(pErrorCode);
    if (UVar1 == '\0') {
      return (char *)0x0;
    }
    if (alias == (char *)0x0) break;
    if (*alias == '\0') {
      return (char *)0x0;
    }
    uVar2 = findConverter(alias,containsOption,pErrorCode);
    iVar3 = iVar3 + 1;
    if (uVar2 < gMainTable.converterListSize) {
      return (char *)((ulong)((uint)gMainTable.converterList[uVar2] * 2) +
                     (long)gMainTable.stringTable);
    }
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return (char *)0x0;
}

Assistant:

U_CAPI const char *
ucnv_io_getConverterName(const char *alias, UBool *containsOption, UErrorCode *pErrorCode) {
    const char *aliasTmp = alias;
    int32_t i = 0;
    for (i = 0; i < 2; i++) {
        if (i == 1) {
            /*
             * After the first unsuccess converter lookup, check to see if
             * the name begins with 'x-'. If it does, strip it off and try
             * again.  This behaviour is similar to how ICU4J does it.
             */
            if (aliasTmp[0] == 'x' && aliasTmp[1] == '-') {
                aliasTmp = aliasTmp+2;
            } else {
                break;
            }
        }
        if(haveAliasData(pErrorCode) && isAlias(aliasTmp, pErrorCode)) {
            uint32_t convNum = findConverter(aliasTmp, containsOption, pErrorCode);
            if (convNum < gMainTable.converterListSize) {
                return GET_STRING(gMainTable.converterList[convNum]);
            }
            /* else converter not found */
        } else {
            break;
        }
    }

    return NULL;
}